

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string.c
# Opt level: O1

void test_archive_string(void)

{
  archive_string *paVar1;
  archive_string local_a8;
  archive_string local_88;
  archive_string local_68;
  archive_string local_48;
  
  local_68.s = (char *)0x0;
  local_68.length = 0;
  local_68.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'6',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'6',0,"0",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'6',(char *)0x0,"((void*)0)",local_68.s,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_string_ensure(&local_68,5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'9',(uint)(&local_68 == paVar1),"&s == archive_string_ensure(&s, 5)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L':',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L':',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L':',(uint)(local_68.s != (char *)0x0),"NULL != (s).s",(void *)0x0);
  paVar1 = archive_string_ensure(&local_68,0x1f);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'=',(uint)(&local_68 == paVar1),"&s == archive_string_ensure(&s, EXTENT - 1)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'>',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'>',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'>',(uint)(local_68.s != (char *)0x0),"NULL != (s).s",(void *)0x0);
  paVar1 = archive_string_ensure(&local_68,0x20);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'@',(uint)(&local_68 == paVar1),"&s == archive_string_ensure(&s, EXTENT)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'A',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'A',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'A',(uint)(local_68.s != (char *)0x0),"NULL != (s).s",(void *)0x0);
  paVar1 = archive_string_ensure(&local_68,0x21);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'C',(uint)(&local_68 == paVar1),"&s == archive_string_ensure(&s, EXTENT + 1)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'D',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'D',0x40,"2 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'D',(uint)(local_68.s != (char *)0x0),"NULL != (s).s",(void *)0x0);
  archive_string_free(&local_68);
  local_68.buffer_length = 0;
  local_68.s = (char *)0x0;
  local_68.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'O',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'O',0,"0",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'O',(char *)0x0,"((void*)0)",local_68.s,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_strcat(&local_68,"");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'R',(uint)(&local_68 == paVar1),"&s == archive_strcat(&s, \"\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'S',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'S',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'S',"","\"\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_strcat(&local_68,"");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'V',(uint)(&local_68 == paVar1),"&s == archive_strcat(&s, \"\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'W',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'W',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'W',"","\"\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_strcat(&local_68,"fubar");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'Z',(uint)(&local_68 == paVar1),"&s == archive_strcat(&s, \"fubar\")",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'[',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'[',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'[',"fubar","\"fubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_strcat(&local_68,"baz");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'^',(uint)(&local_68 == paVar1),"&s == archive_strcat(&s, \"baz\")",(void *)0x0
                  );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'_',8,"8",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'_',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'_',"fubarbaz","\"fubarbaz\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  archive_string_free(&local_68);
  local_68.buffer_length = 0;
  local_68.s = (char *)0x0;
  local_68.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'j',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'j',0,"0",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'j',(char *)0x0,"((void*)0)",local_68.s,"(s).s",(void *)0x0,L'\0');
  archive_strappend_char(&local_68,'X');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'n',1,"1",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'n',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'n',"X","\"X\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  archive_strappend_char(&local_68,'Y');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'r',2,"2",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'r',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'r',"XY","\"XY\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  archive_string_free(&local_68);
  local_68.buffer_length = 0;
  local_68.s = (char *)0x0;
  local_68.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x81',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x81',0,"0",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x81',(char *)0x0,"((void*)0)",local_68.s,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_strncat(&local_68,"snafu",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'\x84',(uint)(&local_68 == paVar1),"&s == archive_strncat(&s, \"snafu\", 5)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x85',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x85',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x85',"snafu","\"snafu\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_strncat(&local_68,"barbazqux",3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'\x88',(uint)(&local_68 == paVar1),
                   "&s == archive_strncat(&s, \"barbazqux\", 3)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x89',8,"8",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x89',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x89',"snafubar","\"snafubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_strncat(&local_68,"snafu",8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'\x8c',(uint)(&local_68 == paVar1),"&s == archive_strncat(&s, \"snafu\", 8)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x8d',0xd,"13",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x8d',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x8d',"snafubarsnafu","\"snafubarsnafu\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  archive_string_free(&local_68);
  local_68.buffer_length = 0;
  local_68.s = (char *)0x0;
  local_68.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x98',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x98',0,"0",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x98',(char *)0x0,"((void*)0)",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"fubar",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'\x9b',(uint)(&local_68 == paVar1),"&s == archive_strncpy(&s, \"fubar\", 5)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x9c',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x9c',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x9c',"fubar","\"fubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"snafubar",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'\x9f',(uint)(&local_68 == paVar1),"&s == archive_strncpy(&s, \"snafubar\", 5)"
                   ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\xa0',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\xa0',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\xa0',"snafu","\"snafu\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"snafu",8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'£',(uint)(&local_68 == paVar1),"&s == archive_strncpy(&s, \"snafu\", 8)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'¤',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'¤',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'¤',"snafu","\"snafu\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  archive_string_free(&local_68);
  local_68.buffer_length = 0;
  local_68.s = (char *)0x0;
  local_68.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'¯',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'¯',0,"0",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'¯',(char *)0x0,"((void*)0)",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"snafu",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'²',(uint)(&local_68 == paVar1),"&s == archive_strcpy(&s, \"snafu\")",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'³',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'³',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'³',"snafu","\"snafu\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"foo",3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'¶',(uint)(&local_68 == paVar1),"&s == archive_strcpy(&s, \"foo\")",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'·',3,"3",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'·',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'·',"foo","\"foo\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"",0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'º',(uint)(&local_68 == paVar1),"&s == archive_strcpy(&s, \"\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'»',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'»',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'»',"","\"\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  archive_string_free(&local_68);
  local_68.s = (char *)0x0;
  local_68.length = 0;
  local_68.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Æ',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Æ',0,"0",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Æ',(char *)0x0,"((void*)0)",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_a8.s = (char *)0x0;
  local_a8.length = 0;
  local_a8.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'È',0,"0",0,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'È',0,"0",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'È',(char *)0x0,"((void*)0)",local_a8.s,"(t).s",(void *)0x0,L'\0');
  local_88.s = (char *)0x0;
  local_88.length = 0;
  local_88.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ê',0,"0",0,"(u).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ê',0,"0",local_88.buffer_length,"(u).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ê',(char *)0x0,"((void*)0)",local_88.s,"(u).s",(void *)0x0,L'\0');
  local_48.s = (char *)0x0;
  local_48.length = 0;
  local_48.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ì',0,"0",0,"(v).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ì',0,"0",local_48.buffer_length,"(v).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ì',(char *)0x0,"((void*)0)",local_48.s,"(v).s",(void *)0x0,L'\0');
  archive_string_concat(&local_a8,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ð',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ð',0,"0",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ð',(char *)0x0,"((void*)0)",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ñ',0,"0",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ñ',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ñ',"","\"\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"",0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'Ô',(uint)(&local_68 == paVar1),"&s == archive_strcpy(&s, \"\")",(void *)0x0);
  archive_string_concat(&local_88,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ö',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ö',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ö',"","\"\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'×',0,"0",local_88.length,"(u).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'×',0x20,"32",local_88.buffer_length,"(u).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'×',"","\"\"",local_88.s,"(u).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"foo",3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'Ú',(uint)(&local_68 == paVar1),"&s == archive_strcpy(&s, \"foo\")",
                   (void *)0x0);
  archive_string_concat(&local_48,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ü',3,"3",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ü',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ü',"foo","\"foo\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ý',3,"3",local_48.length,"(v).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ý',0x20,"32",local_48.buffer_length,"(v).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ý',"foo","\"foo\"",local_48.s,"(v).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"",0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'à',(uint)(&local_68 == paVar1),"&s == archive_strcpy(&s, \"\")",(void *)0x0);
  local_a8.length = 0;
  paVar1 = archive_strncat(&local_a8,"",0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'á',(uint)(&local_a8 == paVar1),"&t == archive_strcpy(&t, \"\")",(void *)0x0);
  archive_string_concat(&local_a8,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ã',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ã',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ã',"","\"\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ä',0,"0",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ä',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ä',"","\"\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"snafu",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'ç',(uint)(&local_68 == paVar1),"&s == archive_strcpy(&s, \"snafu\")",
                   (void *)0x0);
  local_a8.length = 0;
  paVar1 = archive_strncat(&local_a8,"",0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'è',(uint)(&local_a8 == paVar1),"&t == archive_strcpy(&t, \"\")",(void *)0x0);
  archive_string_concat(&local_a8,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ê',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ê',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ê',"snafu","\"snafu\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ë',5,"5",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ë',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ë',"snafu","\"snafu\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  archive_string_free(&local_48);
  archive_string_free(&local_88);
  archive_string_free(&local_a8);
  archive_string_free(&local_68);
  local_68.s = (char *)0x0;
  local_68.length = 0;
  local_68.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ù',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ù',0,"0",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ù',(char *)0x0,"((void*)0)",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_a8.s = (char *)0x0;
  local_a8.length = 0;
  local_a8.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'û',0,"0",0,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'û',0,"0",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'û',(char *)0x0,"((void*)0)",local_a8.s,"(t).s",(void *)0x0,L'\0');
  local_88.s = (char *)0x0;
  local_88.length = 0;
  local_88.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ý',0,"0",0,"(u).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ý',0,"0",local_88.buffer_length,"(u).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ý',(char *)0x0,"((void*)0)",local_88.s,"(u).s",(void *)0x0,L'\0');
  local_48.s = (char *)0x0;
  local_48.length = 0;
  local_48.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ÿ',0,"0",0,"(v).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ÿ',0,"0",local_48.buffer_length,"(v).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ÿ',(char *)0x0,"((void*)0)",local_48.s,"(v).s",(void *)0x0,L'\0');
  local_a8.length = 0;
  archive_string_concat(&local_a8,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ă',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ă',0,"0",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ă',(char *)0x0,"((void*)0)",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ą',0,"0",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ą',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ą',"","\"\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  local_88.length = 0;
  archive_string_concat(&local_88,&local_a8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĉ',0,"0",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĉ',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ĉ',"","\"\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ĉ',0,"0",local_88.length,"(u).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ĉ',0x20,"32",local_88.buffer_length,"(u).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ĉ',"","\"\"",local_88.s,"(u).s",(void *)0x0,L'\0');
  local_88.length = 0;
  archive_string_concat(&local_88,&local_a8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'č',0,"0",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'č',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'č',"","\"\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ď',0,"0",local_88.length,"(u).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ď',0x20,"32",local_88.buffer_length,"(u).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ď',"","\"\"",local_88.s,"(u).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"snafubar",8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'đ',(uint)(paVar1 != (archive_string *)0x0),
                   "NULL != archive_strcpy(&s, \"snafubar\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ē',8,"8",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ē',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ē',"snafubar","\"snafubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_48.length = 0;
  archive_string_concat(&local_48,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ĕ',8,"8",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ĕ',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ĕ',"snafubar","\"snafubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ė',8,"8",local_48.length,"(v).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ė',0x20,"32",local_48.buffer_length,"(v).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ė',"snafubar","\"snafubar\"",local_48.s,"(v).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ę',0,"0",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ę',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ę',"","\"\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  local_a8.length = 0;
  archive_string_concat(&local_a8,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ě',8,"8",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ě',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ě',"snafubar","\"snafubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĝ',8,"8",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĝ',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ĝ',"snafubar","\"snafubar\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"fubar",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'ğ',(uint)(paVar1 != (archive_string *)0x0),
                   "NULL != archive_strcpy(&s, \"fubar\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ġ',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ġ',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ġ',"fubar","\"fubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_a8.length = 0;
  archive_string_concat(&local_a8,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ģ',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ģ',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ģ',"fubar","\"fubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĥ',5,"5",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĥ',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ĥ',"fubar","\"fubar\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  archive_string_free(&local_48);
  archive_string_free(&local_88);
  archive_string_free(&local_a8);
  archive_string_free(&local_68);
  local_68.buffer_length = 0;
  local_68.s = (char *)0x0;
  local_68.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ŀ',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ŀ',0,"0",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ŀ',(char *)0x0,"((void*)0)",local_68.s,"(s).s",(void *)0x0,L'\0');
  archive_string_sprintf(&local_68,"%s","");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ń',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ń',0x40,"2 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ń',"","\"\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  archive_string_sprintf(&local_68,"%s","0123456789abcdef0123456789abcdef");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ň',0x20,"32",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ň',0x40,"2 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ň',"0123456789abcdef0123456789abcdef","s32",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  archive_string_sprintf(&local_68,"%s","0123456789abcdef0123456789abcdef0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ŋ',0x21,"33",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ŋ',0x40,"2 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ŋ',"0123456789abcdef0123456789abcdef0","s33",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  archive_string_sprintf
            (&local_68,"%s","0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ŏ',0x40,"64",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ŏ',0x80,"4 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ŏ',"0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef","s64",
             local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  archive_string_sprintf
            (&local_68,"%s","0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'œ',0x41,"65",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'œ',0x80,"4 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'œ',"0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0","s65",
             local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  archive_string_sprintf
            (&local_68,"%s",
             "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"
            );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ŗ',0x80,"128",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ŗ',0x100,"8 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ŗ',
             "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"
             ,"s128",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  archive_string_sprintf
            (&local_68,"%s",
             "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0"
            );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ś',0x81,"129",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ś',0x100,"8 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ś',
             "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0"
             ,"s129",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  archive_string_sprintf(&local_68,"%d",0x499602d2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ş',10,"10",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ş',0x100,"8 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ş',"1234567890","\"1234567890\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  archive_string_free(&local_68);
  return;
}

Assistant:

static void
test_archive_string_ensure(void)
{
	struct archive_string s;

	archive_string_init(&s);
	assertExactString(0, 0, NULL, s);

	/* single-extent allocation */
	assert(&s == archive_string_ensure(&s, 5));
	assertNonNULLString(0, EXTENT, s);

	/* what happens around extent boundaries? */
	assert(&s == archive_string_ensure(&s, EXTENT - 1));
	assertNonNULLString(0, EXTENT, s);

	assert(&s == archive_string_ensure(&s, EXTENT));
	assertNonNULLString(0, EXTENT, s);

	assert(&s == archive_string_ensure(&s, EXTENT + 1));
	assertNonNULLString(0, 2 * EXTENT, s);

	archive_string_free(&s);
}